

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_method_process.cpp
# Opt level: O2

void __thiscall
sc_core::sc_method_process::resume_process
          (sc_method_process *this,sc_descendant_inclusion_info descendants)

{
  uint uVar1;
  long lVar2;
  sc_runnable *psVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar6;
  sc_method_process *psVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar5;
  
  if (descendants == SC_INCLUDE_DESCENDANTS) {
    iVar4 = (*(this->super_sc_process_b).super_sc_object._vptr_sc_object[5])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    uVar9 = (ulong)(plVar5[1] - *plVar5) >> 3;
    uVar8 = 0;
    uVar10 = uVar9 & 0xffffffff;
    if ((int)uVar9 < 1) {
      uVar10 = uVar8;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      lVar2 = *(long *)(*plVar5 + uVar8 * 8);
      if ((lVar2 != 0) &&
         (plVar6 = (long *)__dynamic_cast(lVar2,&sc_object::typeinfo,&sc_process_b::typeinfo,0),
         plVar6 != (long *)0x0)) {
        (**(code **)(*plVar6 + 0x98))(plVar6);
      }
    }
  }
  if ((sc_allow_process_control_corners == '\0') &&
     (uVar1 = (this->super_sc_process_b).m_state, (~uVar1 & 5) == 0)) {
    (this->super_sc_process_b).m_state = uVar1 & 0xfffffffb;
    sc_process_b::report_error
              (&this->super_sc_process_b,"Undefined process control interaction",
               "call to resume() on a disabled suspended method");
  }
  uVar1 = (this->super_sc_process_b).m_state;
  (this->super_sc_process_b).m_state = uVar1 & 0xfffffffb;
  if ((((uVar1 & 2) != 0) &&
      ((this->super_sc_process_b).m_state = uVar1 & 0xfffffff9,
      (this->super_sc_process_b).m_runnable_p == (sc_process_b *)0x0)) &&
     (psVar7 = (sc_method_process *)sc_get_current_process_b(), psVar7 != this)) {
    psVar3 = ((this->super_sc_process_b).super_sc_object.m_simc)->m_runnable;
    (this->super_sc_process_b).m_runnable_p = (sc_process_b *)0xdb;
    (psVar3->m_methods_push_tail->super_sc_process_b).m_runnable_p = &this->super_sc_process_b;
    psVar3->m_methods_push_tail = this;
    sc_process_b::remove_dynamic_events(&this->super_sc_process_b,false);
    return;
  }
  return;
}

Assistant:

void sc_method_process::resume_process(
    sc_descendant_inclusion_info descendants )
{

    // IF NEEDED PROPOGATE THE RESUME REQUEST THROUGH OUR DESCENDANTS:

    if ( descendants == SC_INCLUDE_DESCENDANTS )
    {
        const std::vector<sc_object*>& children = get_child_objects();
        int                            child_n  = children.size();

        for ( int child_i = 0; child_i < child_n; child_i++ )
        {
            sc_process_b* child_p = dynamic_cast<sc_process_b*>(children[child_i]);
            if ( child_p ) child_p->resume_process(descendants);
        }
    }


    // BY DEFAULT THE CORNER CASE IS AN ERROR:

    if ( !sc_allow_process_control_corners && (m_state & ps_bit_disabled) &&
         (m_state & ps_bit_suspended) )
    {
        m_state = m_state & ~ps_bit_suspended;
        report_error( SC_ID_PROCESS_CONTROL_CORNER_CASE_,
                      "call to resume() on a disabled suspended method" );
        // may continue, if suppressed
    }

    // CLEAR THE SUSPENDED BIT:

    m_state = m_state & ~ps_bit_suspended;

    // RESUME OBJECT INSTANCE:
    //
    // If this is not a self-resume and the method is ready to run then
    // put it on the runnable queue.

    if ( m_state & ps_bit_ready_to_run )
    {
	m_state = m_state & ~ps_bit_ready_to_run;
	if ( next_runnable() == 0 &&
	   ( sc_get_current_process_b() != dynamic_cast<sc_process_b*>(this) ) )
        {
	    simcontext()->push_runnable_method(this);
	    remove_dynamic_events();
	}
    }
}